

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoTriangle>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZGeoTriangle> *this,int64_t id,TPZVec<long> *nodeindexes,
          int matind,TPZGeoMesh *mesh)

{
  TPZReference *pTVar1;
  
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoTriangle>).super_TPZGeoEl =
       &PTR__TPZSavable_0187f140;
  TPZGeoElRefLess<pzgeom::TPZGeoTriangle>::TPZGeoElRefLess
            (&this->super_TPZGeoElRefLess<pzgeom::TPZGeoTriangle>,&PTR_PTR_0187c6b8,id,nodeindexes,
             matind,mesh);
  *(undefined ***)&(this->super_TPZGeoElRefLess<pzgeom::TPZGeoTriangle>).super_TPZGeoEl =
       &PTR__TPZGeoElRefPattern_0187c3b8;
  (this->fSubEl)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  (this->fSubEl).fStore = (long *)0x0;
  (this->fSubEl).fNElements = 0;
  (this->fSubEl).fNAlloc = 0;
  pTVar1 = (TPZReference *)operator_new(0x10);
  (pTVar1->fCounter).super___atomic_base<int>._M_i = 0;
  pTVar1->fPointer = (TPZRefPattern *)0x0;
  LOCK();
  (pTVar1->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fRefPattern).fRef = pTVar1;
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(int64_t id,TPZVec<int64_t> &nodeindexes,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(id,nodeindexes,matind,mesh) {
}